

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddColumnType(Parse *pParse,Token *pType)

{
  Table *pTVar1;
  Column *pCVar2;
  char cVar3;
  char *pcVar4;
  int iVar5;
  Column *pCol;
  Table *p;
  Token *pType_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  if ((pTVar1 != (Table *)0x0) && (0 < pTVar1->nCol)) {
    pCVar2 = pTVar1->aCol;
    iVar5 = pTVar1->nCol + -1;
    pcVar4 = sqlite3NameFromToken(pParse->db,pType);
    pCVar2[iVar5].zType = pcVar4;
    cVar3 = sqlite3AffinityType(pCVar2[iVar5].zType);
    pCVar2[iVar5].affinity = cVar3;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumnType(Parse *pParse, Token *pType){
  Table *p;
  Column *pCol;

  p = pParse->pNewTable;
  if( p==0 || NEVER(p->nCol<1) ) return;
  pCol = &p->aCol[p->nCol-1];
  assert( pCol->zType==0 );
  pCol->zType = sqlite3NameFromToken(pParse->db, pType);
  pCol->affinity = sqlite3AffinityType(pCol->zType);
}